

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::cast_from_variable_load
          (CompilerGLSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  undefined1 local_b0 [36];
  ID local_8c;
  BaseType expected_type;
  BuiltIn builtin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  spirv_cross local_58 [36];
  ID local_34;
  SPIRVariable *local_30;
  SPIRVariable *var;
  SPIRType *expr_type_local;
  string *expr_local;
  CompilerGLSL *pCStack_10;
  uint32_t source_id_local;
  CompilerGLSL *this_local;
  
  var = (SPIRVariable *)expr_type;
  expr_type_local = (SPIRType *)expr;
  expr_local._4_4_ = source_id;
  pCStack_10 = this;
  bVar1 = VectorView<unsigned_int>::empty(&(expr_type->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    return;
  }
  local_30 = Compiler::maybe_get_backing_variable(&this->super_Compiler,expr_local._4_4_);
  if (local_30 != (SPIRVariable *)0x0) {
    expr_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_30->super_IVariant).self);
  }
  TypedID<(spirv_cross::Types)0>::TypedID(&local_34,expr_local._4_4_);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_34,DecorationBuiltIn);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = is_legacy(this);
    if (!bVar1) {
      return;
    }
    if (*(int *)&(var->super_IVariant).field_0xc != 7) {
      return;
    }
    if (local_30 == (SPIRVariable *)0x0) {
      return;
    }
    if (local_30->storage != StorageClassInput) {
      return;
    }
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_78,this,var,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (local_58,local_78,(char (*) [2])0x601bd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr_type_local,
               (char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)local_58);
    ::std::__cxx11::string::~string((string *)local_58);
    ::std::__cxx11::string::~string((string *)local_78);
    return;
  }
  TypedID<(spirv_cross::Types)0>::TypedID(&local_8c,expr_local._4_4_);
  expected_type = Compiler::get_decoration(&this->super_Compiler,local_8c,DecorationBuiltIn);
  local_b0._32_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
  if ((((expected_type - Short < 3) || (expected_type - Int64 < 2)) || (expected_type == Sampler))
     || (expected_type == RayQuery)) {
LAB_003bd180:
    local_b0._32_4_ = 7;
  }
  else {
    if (5 < expected_type + ~Char) {
      if (((expected_type - 0x2a < 2) || (expected_type - 0x1148 < 3)) ||
         ((expected_type == 0x1150 || ((expected_type == 0x115c || (expected_type == 0x1396))))))
      goto LAB_003bd180;
      if ((2 < expected_type - 0x14ae) && (1 < expected_type - 0x14c7)) {
        if (expected_type == 0x14cf) goto LAB_003bd180;
        if (expected_type != 0x14e7) goto LAB_003bd19a;
      }
    }
    local_b0._32_4_ = 8;
  }
LAB_003bd19a:
  if (local_b0._32_4_ != *(uint *)&(var->super_IVariant).field_0xc) {
    bitcast_expression((CompilerGLSL *)local_b0,(SPIRType *)this,(BaseType)var,
                       (string *)(ulong)(uint)local_b0._32_4_);
    ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)local_b0);
    ::std::__cxx11::string::~string((string *)local_b0);
  }
  return;
}

Assistant:

void CompilerGLSL::cast_from_variable_load(uint32_t source_id, std::string &expr, const SPIRType &expr_type)
{
	// We will handle array cases elsewhere.
	if (!expr_type.array.empty())
		return;

	auto *var = maybe_get_backing_variable(source_id);
	if (var)
		source_id = var->self;

	// Only interested in standalone builtin variables.
	if (!has_decoration(source_id, DecorationBuiltIn))
	{
		// Except for int attributes in legacy GLSL, which are cast from float.
		if (is_legacy() && expr_type.basetype == SPIRType::Int && var && var->storage == StorageClassInput)
			expr = join(type_to_glsl(expr_type), "(", expr, ")");
		return;
	}

	auto builtin = static_cast<BuiltIn>(get_decoration(source_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;

	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInInstanceId:
	case BuiltInInstanceIndex:
	case BuiltInVertexId:
	case BuiltInVertexIndex:
	case BuiltInSampleId:
	case BuiltInBaseVertex:
	case BuiltInBaseInstance:
	case BuiltInDrawIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInInstanceCustomIndexNV:
	case BuiltInSampleMask:
	case BuiltInPrimitiveShadingRateKHR:
	case BuiltInShadingRateKHR:
		expected_type = SPIRType::Int;
		break;

	case BuiltInGlobalInvocationId:
	case BuiltInLocalInvocationId:
	case BuiltInWorkgroupId:
	case BuiltInLocalInvocationIndex:
	case BuiltInWorkgroupSize:
	case BuiltInNumWorkgroups:
	case BuiltInIncomingRayFlagsNV:
	case BuiltInLaunchIdNV:
	case BuiltInLaunchSizeNV:
	case BuiltInPrimitiveTriangleIndicesEXT:
	case BuiltInPrimitiveLineIndicesEXT:
	case BuiltInPrimitivePointIndicesEXT:
		expected_type = SPIRType::UInt;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
		expr = bitcast_expression(expr_type, expected_type, expr);
}